

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::StreamArchive::write_exported_metadata(StreamArchive *this,void *data_,size_t size)

{
  size_type sVar1;
  ulong uVar2;
  long lVar3;
  _Hash_node_base *p_Var4;
  bool bVar5;
  long lVar6;
  size_t sVar7;
  _Hash_node_base *p_Var8;
  undefined8 *puVar9;
  uint i;
  uint8_t *data;
  size_type *psVar10;
  undefined8 *puVar11;
  
  if (size < 0xb0) {
    return false;
  }
  *(undefined8 *)data_ = 0xb10bf05511153;
  *(size_t *)((long)data_ + 8) = size;
  psVar10 = &this->seen_blobs[0]._M_h._M_element_count;
  sVar7 = 0xb0;
  lVar6 = 0x18;
  do {
    *(size_t *)((long)data_ + lVar6 + -8) = sVar7;
    sVar1 = *psVar10;
    *(size_type *)((long)data_ + lVar6) = sVar1;
    sVar7 = sVar1 * 0x20 + sVar7;
    lVar6 = lVar6 + 0x10;
    psVar10 = psVar10 + 7;
  } while (lVar6 != 0xb8);
  if (sVar7 == size) {
    lVar6 = 0;
    do {
      puVar11 = (undefined8 *)(*(long *)((long)data_ + lVar6 * 0x10 + 0x10) + (long)data_);
      puVar9 = puVar11;
      for (p_Var8 = this->seen_blobs[lVar6]._M_h._M_before_begin._M_nxt;
          p_Var8 != (_Hash_node_base *)0x0; p_Var8 = p_Var8->_M_nxt) {
        p_Var4 = p_Var8[2]._M_nxt;
        *puVar9 = p_Var8[1]._M_nxt;
        puVar9[1] = p_Var4;
        p_Var4 = p_Var8[4]._M_nxt;
        puVar9[2] = p_Var8[3]._M_nxt;
        puVar9[3] = p_Var4;
        puVar9 = puVar9 + 4;
      }
      uVar2 = this->seen_blobs[lVar6]._M_h._M_element_count;
      if (uVar2 != 0) {
        lVar3 = 0x3f;
        if (uVar2 != 0) {
          for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<Fossilize::ExportedMetadataBlock*,long,__gnu_cxx::__ops::_Iter_comp_iter<Fossilize::StreamArchive::write_exported_metadata(void*,unsigned_long)const::_lambda(Fossilize::ExportedMetadataBlock_const&,Fossilize::ExportedMetadataBlock_const&)_1_>>
                  (puVar11,puVar11 + uVar2 * 4,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<Fossilize::ExportedMetadataBlock*,__gnu_cxx::__ops::_Iter_comp_iter<Fossilize::StreamArchive::write_exported_metadata(void*,unsigned_long)const::_lambda(Fossilize::ExportedMetadataBlock_const&,Fossilize::ExportedMetadataBlock_const&)_1_>>
                  (puVar11,puVar11 + uVar2 * 4);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10);
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool write_exported_metadata(void *data_, size_t size) const override
	{
		auto *data = static_cast<uint8_t *>(data_);
		auto *header = static_cast<ExportedMetadataHeader *>(data_);
		if (size < sizeof(*header))
			return false;

		header->magic = ExportedMetadataMagic;
		header->size = size;

		size_t offset = sizeof(*header);
		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			header->lists[i].offset = offset;
			header->lists[i].count = seen_blobs[i].size();
			offset += header->lists[i].count * sizeof(ExportedMetadataBlock);
		}

		if (offset != size)
			return false;

		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto *blocks = reinterpret_cast<ExportedMetadataBlock *>(data + header->lists[i].offset);
			auto *pblocks = blocks;

			for (auto &blob : seen_blobs[i])
			{
				auto &block = *pblocks;
				block.hash = blob.first;
				block.file_offset = blob.second.offset;
				block.payload = blob.second.header;
				pblocks++;
			}

			// Sorting here is somewhat important, since we will be using binary search when looking up exported metadata.
			// Conserving memory is also somewhat important, so we should only have one copy of the data structures we need
			// in immutable shared memory.
			// For hashmaps we would either need to make a completely custom SHM compatible hashmap implementation, which
			// would likely consume more memory either way.
			std::sort(blocks, blocks + seen_blobs[i].size(), [](const ExportedMetadataBlock &a, const ExportedMetadataBlock &b) {
				return a.hash < b.hash;
			});
		}

		return true;
	}